

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O3

void __thiscall
fmt::v10::detail::ansi_color_escape<char>::ansi_color_escape
          (ansi_color_escape<char> *this,color_type text_color,char *esc)

{
  color_union cVar1;
  int i;
  int iVar2;
  long lVar3;
  size_t sVar4;
  char cVar5;
  uint uVar6;
  size_t __n;
  char *pcVar7;
  char *pcVar8;
  byte bVar9;
  
  cVar1 = text_color.value;
  if (((ulong)text_color & 1) != 0) {
    lVar3 = 0;
    do {
      this->buffer[lVar3] = esc[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 7);
    uVar6 = text_color.value._2_2_ & 0xff;
    this->buffer[7] = (byte)(uVar6 * 0x29 >> 0xc) | 0x30;
    uVar6 = uVar6 / 10;
    cVar5 = (char)uVar6;
    this->buffer[8] = cVar5 + ((byte)(uVar6 / 5) & 6) * -5 | 0x30;
    this->buffer[9] = text_color.value._2_1_ + cVar5 * -10 | 0x30;
    this->buffer[10] = ';';
    uVar6 = cVar1.rgb_color >> 8 & 0xff;
    this->buffer[0xb] = (byte)(uVar6 * 0x29 >> 0xc) | 0x30;
    uVar6 = uVar6 / 10;
    cVar5 = (char)uVar6;
    this->buffer[0xc] = cVar5 + ((byte)(uVar6 / 5) & 6) * -5 | 0x30;
    this->buffer[0xd] = text_color.value._1_1_ + cVar5 * -10 | 0x30;
    this->buffer[0xe] = ';';
    this->buffer[0xf] = (byte)((cVar1.rgb_color & 0xff) * 0x29 >> 0xc) | 0x30;
    uVar6 = (cVar1.rgb_color & 0xff) / 10;
    cVar5 = (char)uVar6;
    this->buffer[0x10] = cVar5 + ((byte)(uVar6 / 5) & 6) * -5 | 0x30;
    this->buffer[0x11] = text_color.value._0_1_ + cVar5 * -10 | 0x30;
    this->buffer[0x12] = 'm';
    pcVar8 = this->buffer + 0x13;
    goto LAB_001094be;
  }
  sVar4 = strlen(esc);
  if (sVar4 == 0) {
LAB_0010945a:
    uVar6 = (cVar1.rgb_color & 0xff) + 10;
    if (sVar4 != 7) {
      uVar6 = cVar1.rgb_color & 0xff;
    }
  }
  else {
    __n = 7;
    if (sVar4 < 7) {
      __n = sVar4;
    }
    iVar2 = bcmp(esc,"\x1b[48;2;",__n);
    if (iVar2 == 0) goto LAB_0010945a;
    uVar6 = cVar1.rgb_color & 0xff;
  }
  this->buffer[0] = '\x1b';
  this->buffer[1] = '[';
  lVar3 = 2;
  if (99 < uVar6) {
    this->buffer[2] = '1';
    uVar6 = uVar6 % 100;
    lVar3 = 3;
  }
  bVar9 = (byte)((uVar6 & 0xff) / 10);
  pcVar7 = this->buffer + lVar3;
  pcVar8 = pcVar7 + 3;
  *pcVar7 = bVar9 | 0x30;
  pcVar7[1] = (char)uVar6 + bVar9 * -10 | 0x30;
  pcVar7[2] = 0x6d;
LAB_001094be:
  *pcVar8 = 0;
  return;
}

Assistant:

FMT_CONSTEXPR ansi_color_escape(detail::color_type text_color,
                                  const char* esc) noexcept {
    // If we have a terminal color, we need to output another escape code
    // sequence.
    if (!text_color.is_rgb) {
      bool is_background = esc == string_view("\x1b[48;2;");
      uint32_t value = text_color.value.term_color;
      // Background ASCII codes are the same as the foreground ones but with
      // 10 more.
      if (is_background) value += 10u;

      size_t index = 0;
      buffer[index++] = static_cast<Char>('\x1b');
      buffer[index++] = static_cast<Char>('[');

      if (value >= 100u) {
        buffer[index++] = static_cast<Char>('1');
        value %= 100u;
      }
      buffer[index++] = static_cast<Char>('0' + value / 10u);
      buffer[index++] = static_cast<Char>('0' + value % 10u);

      buffer[index++] = static_cast<Char>('m');
      buffer[index++] = static_cast<Char>('\0');
      return;
    }

    for (int i = 0; i < 7; i++) {
      buffer[i] = static_cast<Char>(esc[i]);
    }
    rgb color(text_color.value.rgb_color);
    to_esc(color.r, buffer + 7, ';');
    to_esc(color.g, buffer + 11, ';');
    to_esc(color.b, buffer + 15, 'm');
    buffer[19] = static_cast<Char>(0);
  }